

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

void __thiscall Omega_h::InputMap::set(InputMap *this,string *name,char *value)

{
  InputScalar *this_00;
  allocator local_59;
  shared_ptr<Omega_h::Input> sptr;
  string local_48;
  
  this_00 = (InputScalar *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_48,value,&local_59);
  InputScalar::InputScalar(this_00,&local_48);
  std::__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Omega_h::InputScalar,void>
            ((__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2> *)&sptr,this_00);
  std::__cxx11::string::~string((string *)&local_48);
  add(this,name,&sptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void InputMap::set(std::string const& name, char const* value) {
  std::shared_ptr<Input> sptr(new InputScalar(value));
  this->add(name, std::move(sptr));
}